

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenidmem.cpp
# Opt level: O1

int main(int argsc,char **argsv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  Token *pTVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  LanguageConfiguration cfg;
  Logger log;
  Lexer lex;
  istringstream input;
  LanguageConfiguration local_2b2;
  undefined1 local_2b0 [40];
  Lexer local_288;
  BaseLogger local_1a8;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  iVar1 = 1;
  if ((argsc == 2) && (__s = argsv[1], *__s != '\0')) {
    sVar2 = strlen(__s);
    local_288._vptr_Lexer = (_func_int **)&local_288.input;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,__s,__s + sVar2 + 1);
    std::__cxx11::istringstream::istringstream(local_190,(string *)&local_288,_S_in);
    if ((istream **)local_288._vptr_Lexer != &local_288.input) {
      operator_delete(local_288._vptr_Lexer,(ulong)(local_288.input + 1));
    }
    local_2b2.multiLineString = false;
    local_2b2.multiLineStringLeftTrim = true;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"<args[1]>","");
    pfederc::Lexer::Lexer(&local_288,&local_2b2,(istream *)local_190,(string *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    pTVar3 = pfederc::Lexer::next(&local_288);
    local_2b0._0_2_ = pTVar3->type;
    pmVar4 = std::__detail::
             _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)pfederc::TOKEN_TYPE_STRINGS_abi_cxx11_,(key_type *)local_2b0);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pfederc::BaseLogger::BaseLogger(&local_1a8,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              ((Logger *)local_2b0,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               &local_1a8);
    pfederc::BaseLogger::~BaseLogger(&local_1a8);
    pfederc::logLexerErrors((Logger *)local_2b0,&local_288);
    pfederc::Logger::~Logger((Logger *)local_2b0);
    pfederc::Lexer::~Lexer(&local_288);
    std::__cxx11::istringstream::~istringstream(local_190);
    std::ios_base::~ios_base(local_118);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argsc, char * argsv[]) {
  if (argsc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(std::string(argsv[1], strlen(argsv[1]) + 1));
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");
  const Token &tok = lex.next();
  std::cout << TOKEN_TYPE_STRINGS.at(tok.getType()) << std::endl;
  Logger log;
  logLexerErrors(log, lex);
  return 0;
}